

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O0

sptr __thiscall pstack::Context::getDwarf(Context *this,sptr *object)

{
  bool bVar1;
  pointer ppVar2;
  mapped_type *this_00;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  sptr sVar4;
  _Self local_30;
  _Self local_28;
  iterator it;
  sptr *object_local;
  Context *this_local;
  shared_ptr<pstack::Dwarf::Info> *dwarf;
  
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>,_std::less<std::shared_ptr<pstack::Elf::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>_>_>_>
       ::find((map<std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>,_std::less<std::shared_ptr<pstack::Elf::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>_>_>_>
               *)object,in_RDX);
  dwarfLookups = dwarfLookups + 1;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>,_std::less<std::shared_ptr<pstack::Elf::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>_>_>_>
       ::end((map<std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>,_std::less<std::shared_ptr<pstack::Elf::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>_>_>_>
              *)object);
  bVar1 = std::operator==(&local_28,&local_30);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::make_shared<pstack::Dwarf::Info,std::shared_ptr<pstack::Elf::Object>&>
              ((shared_ptr<pstack::Elf::Object> *)this);
    this_00 = std::
              map<std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>,_std::less<std::shared_ptr<pstack::Elf::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>_>_>_>
              ::operator[]((map<std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>,_std::less<std::shared_ptr<pstack::Elf::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>_>_>_>
                            *)object,in_RDX);
    std::shared_ptr<pstack::Dwarf::Info>::operator=(this_00,(shared_ptr<pstack::Dwarf::Info> *)this)
    ;
    _Var3._M_pi = extraout_RDX_00;
  }
  else {
    dwarfHits = dwarfHits + 1;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>_>_>
             ::operator->(&local_28);
    std::shared_ptr<pstack::Dwarf::Info>::shared_ptr
              ((shared_ptr<pstack::Dwarf::Info> *)this,&ppVar2->second);
    _Var3._M_pi = extraout_RDX;
  }
  sVar4.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (sptr)sVar4.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Dwarf::Info::sptr
Context::getDwarf(Elf::Object::sptr object)
{
    auto it = dwarfCache.find(object);
    dwarfLookups++;
    if (it != dwarfCache.end()) {
        dwarfHits++;
        return it->second;
    }
    auto dwarf = std::make_shared<Dwarf::Info>(object);
    dwarfCache[object] = dwarf;
    return dwarf;
}